

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedNegative.cpp
# Opt level: O0

bool __thiscall
glcts::DrawBuffersIndexedNegative::ExpectedError
          (DrawBuffersIndexedNegative *this,GLenum expectedResult,char *call)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar3;
  bool bVar4;
  MessageBuilder local_1b0;
  GLenum local_2c;
  char *pcStack_28;
  GLenum error;
  char *call_local;
  DrawBuffersIndexedNegative *pDStack_18;
  GLenum expectedResult_local;
  DrawBuffersIndexedNegative *this_local;
  
  pcStack_28 = call;
  call_local._4_4_ = expectedResult;
  pDStack_18 = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  local_2c = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  bVar4 = call_local._4_4_ == local_2c;
  if (!bVar4) {
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_1b0,(char (*) [10])"Error on ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&stack0xffffffffffffffd8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [8])0x2c128fa);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [10])0x2b6016a);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(uint *)((long)&call_local + 4));
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [12])0x2c3ff37);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_2c);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  }
  return bVar4;
}

Assistant:

bool DrawBuffersIndexedNegative::ExpectedError(glw::GLenum expectedResult, const char* call)
{
	glw::GLenum error = m_context.getRenderContext().getFunctions().getError();

	if (expectedResult != error)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Error on " << call << " call.\n"
						   << "Expected " << expectedResult << " but found " << error << tcu::TestLog::EndMessage;
		return false;
	}
	return true;
}